

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::AllocateLoopHeaders(ByteCodeWriter *this)

{
  ByteCodeWriter *this_local;
  
  FunctionBody::AllocateLoopHeaders(this->m_functionWrite);
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
  ::Map<Js::ByteCodeWriter::AllocateLoopHeaders()::__0>
            ((List<Js::ByteCodeWriter::LoopHeaderData,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->m_loopHeaders,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void ByteCodeWriter::AllocateLoopHeaders()
    {
        m_functionWrite->AllocateLoopHeaders();
        m_loopHeaders->Map([this](int index, ByteCodeWriter::LoopHeaderData& data)
        {
            LoopHeader *loopHeader = m_functionWrite->GetLoopHeader(index);
            loopHeader->startOffset = data.startOffset;
            loopHeader->endOffset = data.endOffset;
            loopHeader->isNested = data.isNested;
            loopHeader->hasYield = data.hasYield;
        });
    }